

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86MOV(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,x86Reg src)

{
  uchar *puVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uchar *puVar5;
  x86Reg index_00;
  
  bVar3 = base == rNONE;
  if ((multiplier == 1 && bVar3) && index != rNONE) {
    base = index;
  }
  index_00 = rNONE;
  if ((multiplier != 1 || !bVar3) || index == rNONE) {
    index_00 = index;
  }
  if (size == sWORD) {
    *stream = 'f';
    if ((src == rEAX) && (index_00 == rNONE && base == rNONE)) {
      stream[1] = 0xa3;
      *(int *)(stream + 2) = shift;
      return 6;
    }
    uVar4 = encodeRex(stream + 1,false,src,index_00,base);
    puVar5 = stream + 1 + uVar4;
    stream[(ulong)uVar4 + 1] = 0x89;
    cVar2 = regCode[src];
  }
  else {
    if (size == sBYTE) {
      if ((src == rEAX) && (index_00 == rNONE && base == rNONE)) {
        *stream = 0xa2;
        *(int *)(stream + 1) = shift;
        return 5;
      }
      uVar4 = encodeRex(stream,4 < (int)src,src,index_00,base);
      puVar5 = stream + uVar4;
      *puVar5 = 0x88;
    }
    else {
      uVar4 = encodeRex(stream,size == sQWORD,src,index_00,base);
      puVar1 = stream + uVar4;
      if ((src == rEAX) && (index_00 == rNONE && base == rNONE)) {
        *puVar1 = 0xa3;
        *(int *)(puVar1 + 1) = shift;
        return ((int)puVar1 - (int)stream) + 5;
      }
      puVar5 = stream + uVar4;
      *puVar1 = 0x89;
    }
    cVar2 = regCode[src];
  }
  uVar4 = encodeAddress(puVar5 + 1,index_00,multiplier,base,shift,(int)cVar2);
  return ((int)(puVar5 + 1) + uVar4) - (int)stream;
}

Assistant:

int x86MOV(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg src)
{
	unsigned char *start = stream;

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	if(size == sBYTE)
	{
		if(src == rEAX && index == rNONE && base == rNONE)
		{
			*stream++ = 0xa2;
			stream += encodeImmDword(stream, shift);

			return int(stream - start);
		}

		// To address byte register after dl, REX prefix is required, on x86 this is not possible at all
		stream += encodeRex(stream, src > rEDX, src, index, base);
		*stream++ = 0x88;
		stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

		return int(stream - start);
	}
	else if(size == sWORD)
	{
		*stream++ = 0x66;	// switch to word

		if(src == rEAX && index == rNONE && base == rNONE)
		{
			*stream++ = 0xa3;
			stream += encodeImmDword(stream, shift);

			return int(stream - start);
		}

		stream += encodeRex(stream, false, src, index, base);
		*stream++ = 0x89;
		stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

		return int(stream - start);
	}

	stream += encodeRex(stream, size == sQWORD, src, index, base);

	if(src == rEAX && index == rNONE && base == rNONE)
	{
		*stream++ = 0xa3;
		stream += encodeImmDword(stream, shift);

		return int(stream - start);
	}

	*stream++ = 0x89;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

	return int(stream - start);
}